

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O1

Token __thiscall flow::lang::Lexer::parseInterpolationFragment(Lexer *this,bool start)

{
  long *plVar1;
  int iVar2;
  Token TVar3;
  char cVar4;
  int iVar5;
  
  (this->stringValue_)._M_string_length = 0;
  *(this->stringValue_)._M_dataplus._M_p = '\0';
  nextChar(this,true);
  iVar2 = this->currentChar_;
  TVar3 = Eof;
  if (iVar2 != -1) {
    cVar4 = (char)this + -0x58;
    iVar5 = -1;
    while (plVar1 = (long *)(this->contexts_).
                            super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
                            ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[4]._M_next,
          (*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 2) == 0) {
      if (iVar5 != 0x5c && iVar2 == 0x22) {
        nextChar(this,true);
        this->interpolationDepth_ = this->interpolationDepth_ + -1;
        TVar3 = InterpolatedStringEnd;
        if (start) {
          TVar3 = String;
        }
        break;
      }
      if (iVar2 == 0x23) {
        nextChar(this,true);
        if (this->currentChar_ != 0x7b) goto LAB_00133d7f;
        nextChar(this,true);
        TVar3 = InterpolatedStringFragment;
        break;
      }
      if (iVar2 == 0x5c) {
        nextChar(this,true);
        iVar2 = this->currentChar_;
        if ((iVar2 == -1) ||
           (plVar1 = (long *)(this->contexts_).
                             super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
                             ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[4]._M_next,
           (*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 2) != 0)) break;
        if (iVar2 < 0x72) {
          if ((iVar2 != 0x5c) && (iVar2 != 0x6e)) {
LAB_00133d7f:
            std::__cxx11::string::push_back(cVar4);
          }
        }
        else if ((iVar2 != 0x72) && (iVar2 != 0x74)) goto LAB_00133d7f;
      }
      std::__cxx11::string::push_back(cVar4);
      iVar5 = this->currentChar_;
      nextChar(this,true);
      iVar2 = this->currentChar_;
      if (iVar2 == -1) break;
    }
  }
  this->token_ = TVar3;
  return TVar3;
}

Assistant:

Token Lexer::parseInterpolationFragment(bool start) {
  int last = -1;
  stringValue_.clear();

  // skip either '"' or '}' depending on your we entered
  nextChar();

  for (;;) {
    if (eof()) return token_ = Token::Eof;

    if (currentChar() == '"' && last != '\\') {
      nextChar();
      --interpolationDepth_;
      return token_ =
                 start ? Token::String : Token::InterpolatedStringEnd;
    }

    if (currentChar() == '\\') {
      nextChar();

      if (eof()) return token_ = Token::Eof;

      switch (currentChar()) {
        case 'r':
          stringValue_ += '\r';
          break;
        case 'n':
          stringValue_ += '\n';
          break;
        case 't':
          stringValue_ += '\t';
          break;
        case '\\':
          stringValue_ += '\\';
          break;
        default:
          stringValue_ += '\\';
          stringValue_ += static_cast<char>(currentChar());
          break;
      }
    } else if (currentChar() == '#') {
      nextChar();
      if (currentChar() == '{') {
        nextChar();
        return token_ = Token::InterpolatedStringFragment;
      } else {
        stringValue_ += '#';
      }
      stringValue_ += static_cast<char>(currentChar());
    } else {
      stringValue_ += static_cast<char>(currentChar());
    }

    last = currentChar();
    nextChar();
  }
}